

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::on_snapshot_completed
          (raft_server *this,ptr<snapshot> *s,bool result,ptr<std::exception> *err)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 uVar4;
  element_type *peVar5;
  ulong uVar6;
  element_type *peVar7;
  element_type *peVar8;
  function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *this_00;
  element_type *peVar9;
  element_type *peVar10;
  byte in_DL;
  long in_RDI;
  handler_type handler;
  ulong compact_upto;
  ptr<raft_params> params;
  ptr<snapshot> new_snp;
  unique_lock<std::recursive_mutex> guard;
  _Placeholder<2> *in_stack_fffffffffffffe58;
  memory_order in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined1 __i;
  _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(unsigned_long,_bool,_std::shared_ptr<std::exception>_&)>
  *in_stack_fffffffffffffe68;
  raft_server *in_stack_fffffffffffffe70;
  context *in_stack_fffffffffffffe78;
  undefined1 local_108 [32];
  string local_e8 [32];
  long local_c8;
  undefined1 local_b0 [16];
  string local_a0 [48];
  string local_70 [48];
  string local_40 [47];
  byte local_11;
  
  local_11 = in_DL & 1;
  bVar1 = std::operator!=((shared_ptr<std::exception> *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    __i = (undefined1)((uint)in_stack_fffffffffffffe64 >> 0x18);
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0d4c);
      iVar2 = (*peVar5->_vptr_logger[7])();
      if (1 < iVar2) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e0d6f);
        peVar3 = std::__shared_ptr_access<std::exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e0d81);
        uVar4 = (**(code **)(*(long *)peVar3 + 0x10))();
        msg_if_given_abi_cxx11_((char *)local_40,"failed to create a snapshot due to %s",uVar4);
        (*peVar5->_vptr_logger[8])
                  (peVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"on_snapshot_completed",600,local_40);
        std::__cxx11::string::~string(local_40);
      }
    }
  }
  else if ((local_11 & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    __i = (undefined1)((uint)in_stack_fffffffffffffe64 >> 0x18);
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0e4c);
      iVar2 = (*peVar5->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e0e6f);
        msg_if_given_abi_cxx11_((char *)local_70,"the state machine rejects to create the snapshot")
        ;
        (*peVar5->_vptr_logger[8])
                  (peVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"on_snapshot_completed",0x25d,local_70);
        std::__cxx11::string::~string(local_70);
      }
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::unique_lock
              ((unique_lock<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (mutex_type *)in_stack_fffffffffffffe58);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0f3b);
      iVar2 = (*peVar5->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e0f6b);
        peVar8 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e0f7d);
        uVar6 = snapshot::get_last_log_idx(peVar8);
        peVar8 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e0f99);
        in_stack_fffffffffffffe78 = (context *)snapshot::get_last_log_term(peVar8);
        msg_if_given_abi_cxx11_
                  ((char *)local_a0,
                   "snapshot idx %lu log_term %lu created, compact the log store if needed",uVar6,
                   in_stack_fffffffffffffe78);
        (*peVar5->_vptr_logger[8])
                  (peVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"on_snapshot_completed",0x265,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
    }
    peVar7 = std::
             __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e105a);
    (*peVar7->_vptr_state_machine[0x10])(local_b0);
    set_last_snapshot(in_stack_fffffffffffffe70,(ptr<snapshot> *)in_stack_fffffffffffffe68);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1e1098);
    nuraft::context::get_params(in_stack_fffffffffffffe78);
    peVar8 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e10b7);
    this_00 = (function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *)
              snapshot::get_last_log_idx(peVar8);
    peVar9 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e10d3);
    if ((function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *)
        (long)peVar9->reserved_log_items_ < this_00) {
      peVar8 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e10f5);
      in_stack_fffffffffffffe68 =
           (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(unsigned_long,_bool,_std::shared_ptr<std::exception>_&)>
            *)snapshot::get_last_log_idx(peVar8);
      peVar9 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1111);
      local_c8 = (long)in_stack_fffffffffffffe68 - (long)peVar9->reserved_log_items_;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e1153);
        in_stack_fffffffffffffe64 = (*peVar5->_vptr_logger[7])();
        if (3 < in_stack_fffffffffffffe64) {
          in_stack_fffffffffffffe58 =
               (_Placeholder<2> *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1183);
          msg_if_given_abi_cxx11_((char *)local_e8,"log_store_ compact upto %lu",local_c8);
          (*(*(_func_int ***)in_stack_fffffffffffffe58)[8])
                    (in_stack_fffffffffffffe58,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"on_snapshot_completed",0x26e,local_e8);
          std::__cxx11::string::~string(local_e8);
        }
      }
      std::
      bind<void(nuraft::raft_server::*)(unsigned_long,bool,std::shared_ptr<std::exception>&),nuraft::raft_server*,unsigned_long&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((offset_in_raft_server_to_subr *)in_stack_fffffffffffffe78,(raft_server **)this_00,
                 &in_stack_fffffffffffffe68->_M_f,
                 (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      std::function<void(bool&,std::shared_ptr<std::exception>&)>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(unsigned_long,bool,std::shared_ptr<std::exception>&)>,void>
                (this_00,in_stack_fffffffffffffe68);
      peVar10 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1e12b4);
      (*peVar10->_vptr_log_store[0xf])(peVar10,local_c8,local_108);
      std::function<void_(bool_&,_std::shared_ptr<std::exception>_&)>::~function
                ((function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *)0x1e12df);
    }
    std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1e1311);
    std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1e131e);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    __i = (undefined1)((uint)in_stack_fffffffffffffe64 >> 0x18);
  }
  std::atomic<bool>::store
            ((atomic<bool> *)in_stack_fffffffffffffe68,(bool)__i,in_stack_fffffffffffffe60);
  return;
}

Assistant:

void raft_server::on_snapshot_completed
     ( ptr<snapshot>& s, bool result, ptr<std::exception>& err )
{
 do { // Dummy loop
    if (err != nilptr) {
        p_er( "failed to create a snapshot due to %s",
              err->what() );
        break;
    }

    if (!result) {
        p_in("the state machine rejects to create the snapshot");
        break;
    }

    {
        recur_lock(lock_);
        p_in("snapshot idx %" PRIu64 " log_term %" PRIu64 " created, "
             "compact the log store if needed",
             s->get_last_log_idx(), s->get_last_log_term());

        ptr<snapshot> new_snp = state_machine_->last_snapshot();
        set_last_snapshot(new_snp);
        ptr<raft_params> params = ctx_->get_params();
        if ( new_snp->get_last_log_idx() >
                 (ulong)params->reserved_log_items_ ) {
            ulong compact_upto = new_snp->get_last_log_idx() -
                                     (ulong)params->reserved_log_items_;
            p_in("log_store_ compact upto %" PRIu64 "", compact_upto);

            cmd_result<bool>::handler_type handler =
                (cmd_result<bool>::handler_type)
                std::bind( &raft_server::on_log_compacted,
                           this,
                           compact_upto,
                           std::placeholders::_1,
                           std::placeholders::_2 );

            log_store_->compact_async(compact_upto, handler);
        }
    }
 } while (false);

    snp_in_progress_.store(false);
}